

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactNSC.h
# Opt level: O2

void __thiscall
chrono::ChContactNSC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<3>_>::
ConstraintsBiLoad_C(ChContactNSC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<3>_>
                    *this,double factor,double recovery_clamp,bool do_clamp)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ChContactable_1vars<6> *pCVar4;
  ChContactable_1vars<3> *pCVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar12 [64];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 in_register_00001248 [56];
  undefined1 auVar16 [64];
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  ChVector<double> v;
  Vector V2_w;
  Vector V1_w;
  Vector Vrel_cplane;
  Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> local_a0;
  undefined1 local_98 [16];
  double local_88;
  undefined1 local_78 [16];
  double local_68;
  undefined1 local_58 [16];
  double local_48;
  double local_38;
  
  auVar16._8_56_ = in_register_00001248;
  auVar16._0_8_ = recovery_clamp;
  auVar12._8_56_ = in_register_00001208;
  auVar12._0_8_ = factor;
  auVar10 = auVar12._0_16_;
  pCVar4 = (this->
           super_ChContactTuple<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<3>_>).
           objA;
  if (((pCVar4 != (ChContactable_1vars<6> *)0x0) &&
      ((this->super_ChContactTuple<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<3>_>)
       .objB != (ChContactable_1vars<3> *)0x0)) &&
     ((this->restitution != 0.0 || (NAN(this->restitution))))) {
    (*(pCVar4->super_ChContactable)._vptr_ChContactable[10])
              (local_58,pCVar4,
               &(this->
                super_ChContactTuple<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<3>_>
                ).p1);
    pCVar5 = (this->
             super_ChContactTuple<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<3>_>).
             objB;
    (*(pCVar5->super_ChContactable)._vptr_ChContactable[10])
              (local_78,pCVar5,
               &(this->
                super_ChContactTuple<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<3>_>
                ).p2);
    local_a0.m_matrix =
         &(this->
          super_ChContactTuple<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<3>_>).
          contact_plane.super_Matrix<double,_3,_3,_1,_3,_3>;
    local_98 = vsubpd_avx(local_78,local_58);
    local_88 = local_68 - local_48;
    chrono::operator*(&local_a0,(ChVector<double> *)local_98);
    auVar10._8_8_ = 0;
    auVar10._0_8_ = factor;
    local_38 = local_38 * this->restitution;
    auVar13._8_8_ = 0;
    auVar13._0_8_ =
         ((((this->
            super_ChContactTuple<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<3>_>).
           container)->super_ChPhysicsItem).system)->min_bounce_speed;
    auVar9._8_8_ = 0x8000000000000000;
    auVar9._0_8_ = 0x8000000000000000;
    auVar9 = vxorpd_avx512vl(auVar13,auVar9);
    if ((local_38 < auVar9._0_8_) &&
       (auVar14._0_8_ = 1.0 / factor, auVar14._8_8_ = 0, auVar2._8_8_ = 0,
       auVar2._0_8_ = (this->
                      super_ChContactTuple<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<3>_>
                      ).norm_dist, auVar19._8_8_ = 0, auVar19._0_8_ = local_38,
       auVar9 = vfmadd213sd_fma(auVar14,auVar19,auVar2), auVar9._0_8_ < 0.0)) {
      local_38 = local_38 +
                 (this->Nx).
                 super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<3>_>
                 .super_ChConstraint.b_i;
      goto LAB_00a9bc53;
    }
  }
  dVar1 = this->compliance;
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    auVar7._8_8_ = 0x8000000000000000;
    auVar7._0_8_ = 0x8000000000000000;
    auVar9 = vxorpd_avx512vl(auVar16._0_16_,auVar7);
    dVar17 = 1.0 / auVar10._0_8_;
    dVar6 = dVar17 + this->dampingf;
    dVar17 = 1.0 / (dVar17 * dVar6);
    (this->Nx).
    super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<3>_>
    .super_ChConstraint.cfm_i = dVar1 * dVar17;
    dVar17 = dVar17 * this->complianceT;
    (this->Tu).
    super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<3>_>
    .super_ChConstraint.cfm_i = dVar17;
    (this->Tv).
    super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<3>_>
    .super_ChConstraint.cfm_i = dVar17;
    dVar1 = (1.0 / dVar6) *
            (this->
            super_ChContactTuple<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<3>_>).
            norm_dist;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = dVar1;
    auVar10 = vmaxsd_avx(auVar11,auVar9);
    local_38 = (double)((ulong)do_clamp * auVar10._0_8_ + (ulong)!do_clamp * (long)dVar1) +
               (this->Nx).
               super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<3>_>
               .super_ChConstraint.b_i;
  }
  else {
    if (!do_clamp) {
      auVar15._8_8_ = 0;
      auVar15._0_8_ =
           (this->
           super_ChContactTuple<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<3>_>).
           norm_dist;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = (this->Nx).
                     super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<3>_>
                     .super_ChConstraint.b_i;
      auVar10 = vfmadd213sd_fma(auVar15,auVar10,auVar3);
      (this->Nx).
      super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<3>_>
      .super_ChConstraint.b_i = auVar10._0_8_;
      return;
    }
    dVar1 = *(double *)&(this->Nx).field_0x100;
    auVar8._8_8_ = 0x8000000000000000;
    auVar8._0_8_ = 0x8000000000000000;
    auVar9 = vxorpd_avx512vl(auVar16._0_16_,auVar8);
    local_38 = (this->Nx).
               super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<3>_>
               .super_ChConstraint.b_i;
    auVar18._8_8_ = 0;
    auVar18._0_8_ =
         auVar10._0_8_ *
         (this->
         super_ChContactTuple<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<3>_>).
         norm_dist;
    auVar10 = vmaxsd_avx(auVar18,auVar9);
    if ((dVar1 != 0.0) || (NAN(dVar1))) {
      auVar10 = vminsd_avx(ZEXT816(0) << 0x40,auVar10);
      local_38 = local_38 + auVar10._0_8_;
    }
    else {
      local_38 = local_38 + auVar10._0_8_;
    }
  }
LAB_00a9bc53:
  (this->Nx).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<3>_>
  .super_ChConstraint.b_i = local_38;
  return;
}

Assistant:

virtual void ConstraintsBiLoad_C(double factor = 1., double recovery_clamp = 0.1, bool do_clamp = false) override {
        bool bounced = false;

        // Elastic Restitution model (use simple Newton model with coefficient e=v(+)/v(-))
        // Note that this works only if the two connected items are two ChBody.

        if (this->objA && this->objB) {
            if (this->restitution) {
                // compute normal rebounce speed
                Vector V1_w = this->objA->GetContactPointSpeed(this->p1);
                Vector V2_w = this->objB->GetContactPointSpeed(this->p2);
                Vector Vrel_w = V2_w - V1_w;
                Vector Vrel_cplane = this->contact_plane.transpose() * Vrel_w;

                double h = 1.0 / factor;  // inverse timestep is factor

                double neg_rebounce_speed = Vrel_cplane.x() * this->restitution;
                if (neg_rebounce_speed < -this->container->GetSystem()->GetMinBounceSpeed())
                    if (this->norm_dist + neg_rebounce_speed * h < 0) {
                        // CASE: BOUNCE
                        bounced = true;
                        Nx.Set_b_i(Nx.Get_b_i() + neg_rebounce_speed);
                    }
            }
        }

        if (!bounced) {
            // CASE: SETTLE (most often, and also default if two colliding items are not two ChBody)

            if (this->compliance) {
                //  inverse timestep is factor
                double h = 1.0 / factor;

                double alpha = this->dampingf;              // [R]=alpha*[K]
                double inv_hpa = 1.0 / (h + alpha);         // 1/(h+a)
                double inv_hhpa = 1.0 / (h * (h + alpha));  // 1/(h*(h+a))

                Nx.Set_cfm_i((inv_hhpa) * this->compliance);  // was (inv_hh)* ...   //***TEST DAMPING***//
                Tu.Set_cfm_i((inv_hhpa) * this->complianceT);
                Tv.Set_cfm_i((inv_hhpa) * this->complianceT);

				double qc = inv_hpa * this->norm_dist;

				// If clamping kicks in(when using large timesteps and low compliance), it acts as a numerical damping.
				if (do_clamp)
					qc = ChMax(qc, -recovery_clamp);

                Nx.Set_b_i(Nx.Get_b_i() + qc); 

            } else {
                // GetLog()<< "rigid " << (int)this << "  recov_clamp=" << recovery_clamp << "\n";
                if (do_clamp)
                    if (this->Nx.GetCohesion())
                        Nx.Set_b_i(Nx.Get_b_i() + ChMin(0.0, ChMax(factor * this->norm_dist, -recovery_clamp)));
                    else
                        Nx.Set_b_i(Nx.Get_b_i() + ChMax(factor * this->norm_dist, -recovery_clamp));
                else
                    Nx.Set_b_i(Nx.Get_b_i() + factor * this->norm_dist);
            }
        }
    }